

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

void __thiscall hwnet::util::TimerMgr::down(TimerMgr *this,size_t idx)

{
  pointer ppTVar1;
  Timer *pTVar2;
  ulong uVar3;
  ulong uVar4;
  
  while( true ) {
    uVar3 = idx * 2;
    uVar4 = idx;
    if ((uVar3 <= this->elements_size) &&
       (ppTVar1 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start, uVar4 = uVar3,
       ppTVar1[idx - 1]->mExpiredTime <= ppTVar1[idx * 2 + -1]->mExpiredTime)) {
      uVar4 = idx;
    }
    if ((uVar3 < this->elements_size) &&
       (ppTVar1 = (this->elements).
                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       ppTVar1[idx * 2]->mExpiredTime < ppTVar1[uVar4 - 1]->mExpiredTime)) {
      uVar4 = idx * 2 + 1;
    }
    if (uVar4 == idx) break;
    ppTVar1 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = ppTVar1[idx - 1];
    ppTVar1[idx - 1] = ppTVar1[uVar4 - 1];
    (this->elements).super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1] = pTVar2;
    ppTVar1 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar1[idx - 1]->mIndex = idx;
    ppTVar1[uVar4 - 1]->mIndex = uVar4;
    idx = uVar4;
  }
  return;
}

Assistant:

void down(size_t idx) {
		auto l = left(idx);
		auto r = right(idx);
		auto min = idx;

		auto offsetIdx = getOffset(idx);
		
		if(l <= this->elements_size) {
			auto offsetL = getOffset(l);
			if(this->elements[offsetL]->mExpiredTime < this->elements[offsetIdx]->mExpiredTime) {
				min = l;
			}
		}

		if(r <= this->elements_size) {
			auto offsetR = getOffset(r);
			auto offsetMin = getOffset(min);
			if(this->elements[offsetR]->mExpiredTime < this->elements[offsetMin]->mExpiredTime) {
				min = r;
			}
		}

		if(min != idx) {
			this->swap(idx,min);
			this->down(min);
		}	
	}